

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O0

double inform_active_info(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  size_t sVar2;
  ulong uVar3;
  uint32_t *puVar4;
  void *__ptr;
  double dVar5;
  undefined4 uVar9;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int local_e8;
  int local_e4;
  int future;
  int history;
  double n_future;
  double n_history;
  double n_state;
  double dStack_c0;
  int state;
  double ai;
  inform_dist futures;
  inform_dist histories;
  inform_dist states;
  uint32_t *data;
  size_t total_size;
  size_t futures_size;
  size_t histories_size;
  size_t states_size;
  size_t N;
  inform_error *err_local;
  size_t k_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  if (_Var1) {
    series_local = (int *)0x7ff8000000000000;
  }
  else {
    sVar2 = n * (m - k);
    auVar10._8_4_ = (int)(k >> 0x20);
    auVar10._0_8_ = k;
    auVar10._12_4_ = 0x45300000;
    dVar5 = pow((double)b,
                (auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar5 = (double)b * dVar5;
    uVar3 = (ulong)dVar5;
    uVar3 = uVar3 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
    puVar4 = (uint32_t *)(uVar3 / (ulong)(long)b);
    __ptr = calloc(uVar3 + (long)puVar4 + (long)b,4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x7ff8000000000000;
    }
    else {
      futures.counts = (long)__ptr + uVar3 * 4;
      ai = (double)((long)__ptr + (long)puVar4 * 4 + uVar3 * 4);
      futures.histogram = (uint32_t *)(long)b;
      futures.size = sVar2;
      histories.histogram = puVar4;
      histories.size = sVar2;
      histories.counts = (uint64_t)__ptr;
      accumulate_observations
                (series,n,m,b,k,(inform_dist *)&histories.counts,(inform_dist *)&futures.counts,
                 (inform_dist *)&ai);
      dStack_c0 = 0.0;
      local_e4 = 0;
      while( true ) {
        uVar9 = (undefined4)(sVar2 >> 0x20);
        if ((int)puVar4 <= local_e4) break;
        dVar5 = (double)*(uint *)(futures.counts + (long)local_e4 * 4);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          for (local_e8 = 0; local_e8 < b; local_e8 = local_e8 + 1) {
            dVar6 = (double)*(uint *)((long)ai + (long)local_e8 * 4);
            if ((dVar6 != 0.0) || (NAN(dVar6))) {
              dVar7 = (double)*(uint *)(histories.counts + (long)(local_e4 * b + local_e8) * 4);
              if ((dVar7 != 0.0) || (NAN(dVar7))) {
                auVar8._8_4_ = uVar9;
                auVar8._0_8_ = sVar2;
                auVar8._12_4_ = 0x45300000;
                dVar6 = log2((((auVar8._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) *
                             dVar7) / (dVar5 * dVar6));
                dStack_c0 = dVar7 * dVar6 + dStack_c0;
              }
            }
          }
        }
        local_e4 = local_e4 + 1;
      }
      free(__ptr);
      auVar11._8_4_ = uVar9;
      auVar11._0_8_ = sVar2;
      auVar11._12_4_ = 0x45300000;
      series_local = (int *)(dStack_c0 /
                            ((auVar11._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
    }
  }
  return (double)series_local;
}

Assistant:

double inform_active_info(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const N = n * (m - k);

    size_t const states_size = (size_t) (b * pow((double) b,(double) k));
    size_t const histories_size = states_size / b;
    size_t const futures_size = b;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };
    inform_dist futures   = { data + states_size + histories_size, futures_size, N };

    accumulate_observations(series, n, m, b, k, &states, &histories, &futures);

    double ai = 0.0;
    int state;
    double n_state, n_history, n_future;
    for (int history = 0; history < (int) histories_size; ++history)
    {
        n_history = histories.histogram[history];
        if (n_history == 0)
        {
            continue;
        }
        for (int future = 0; future < b; ++future)
        {
            n_future = futures.histogram[future];
            if (n_future == 0)
            {
                continue;
            }
            state = history * b + future;
            n_state = states.histogram[state];
            if (n_state == 0)
            {
                continue;
            }
            ai += n_state * log2((N * n_state) / (n_history * n_future));
        }
    }

    free(data);

    return ai / N;
}